

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

_Bool is_set_force_zeromv_skip_based_on_src_sad
                (int set_zeromv_skip_based_on_source_sad,SOURCE_SAD source_sad_nonrd)

{
  SOURCE_SAD source_sad_nonrd_local;
  int set_zeromv_skip_based_on_source_sad_local;
  undefined1 local_1;
  
  if (set_zeromv_skip_based_on_source_sad == 0) {
    local_1 = false;
  }
  else if (set_zeromv_skip_based_on_source_sad < 3) {
    if (set_zeromv_skip_based_on_source_sad < 2) {
      if (set_zeromv_skip_based_on_source_sad < 1) {
        local_1 = false;
      }
      else {
        local_1 = source_sad_nonrd == kZeroSad;
      }
    }
    else {
      local_1 = source_sad_nonrd < kLowSad;
    }
  }
  else {
    local_1 = source_sad_nonrd < kMedSad;
  }
  return local_1;
}

Assistant:

static inline bool is_set_force_zeromv_skip_based_on_src_sad(
    int set_zeromv_skip_based_on_source_sad, SOURCE_SAD source_sad_nonrd) {
  if (set_zeromv_skip_based_on_source_sad == 0) return false;

  if (set_zeromv_skip_based_on_source_sad >= 3)
    return source_sad_nonrd <= kLowSad;
  else if (set_zeromv_skip_based_on_source_sad >= 2)
    return source_sad_nonrd <= kVeryLowSad;
  else if (set_zeromv_skip_based_on_source_sad >= 1)
    return source_sad_nonrd == kZeroSad;

  return false;
}